

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidLoop1(void)

{
  RepeatedField<long> *this;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  TypeUnion TVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  ActivationReLU *pAVar11;
  LayerUnion LVar12;
  NeuralNetwork *this_01;
  NeuralNetworkLayer *pNVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  void *pvVar15;
  CopyLayerParams *pCVar16;
  ostream *poVar17;
  long lVar18;
  undefined8 *puVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  Arena *pAVar21;
  Model m;
  Result res;
  NeuralNetwork nnBody;
  Model MStack_d8;
  Result local_a8;
  NeuralNetwork local_80;
  
  CoreML::Specification::Model::Model(&MStack_d8,(Arena *)0x0,false);
  if (MStack_d8.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_d8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar3 = ((MStack_d8.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001872e5:
    pRVar20 = &(MStack_d8.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((MStack_d8.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_001872e5;
    ((MStack_d8.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar15 = pRVar3->elements[iVar1];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"A",puVar19);
  pFVar7 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
    pFVar7 = *(FeatureType **)((long)pvVar15 + 0x20);
    if (pFVar7 == (FeatureType *)0x0) {
      pAVar21 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
        pAVar21 = *(Arena **)pAVar21;
      }
      pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                         (pAVar21);
      *(FeatureType **)((long)pvVar15 + 0x20) = pFVar7;
    }
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  this = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  if (uVar2 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
    plVar9 = google::protobuf::RepeatedField<long>::elements(this);
    plVar9[uVar2] = 1;
  }
  else {
    plVar9 = google::protobuf::RepeatedField<long>::elements(this);
    plVar9[uVar2] = 1;
  }
  this->current_size_ = uVar2 + 1;
  if (MStack_d8.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_d8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar3 = ((MStack_d8.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0018746b:
    pRVar20 = &(MStack_d8.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((MStack_d8.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0018746b;
    ((MStack_d8.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar15 = pRVar3->elements[iVar1];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"B",puVar19);
  pFVar7 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&local_80,(Arena *)0x0,false);
  if ((local_80.layers_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) ||
     (lVar18 = (long)local_80.layers_.super_RepeatedPtrFieldBase.current_size_,
     (local_80.layers_.super_RepeatedPtrFieldBase.rep_)->allocated_size <=
     local_80.layers_.super_RepeatedPtrFieldBase.current_size_)) {
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        (local_80.layers_.super_RepeatedPtrFieldBase.arena_);
    pNVar13 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&local_80.layers_.super_RepeatedPtrFieldBase,pNVar13);
  }
  else {
    local_80.layers_.super_RepeatedPtrFieldBase.current_size_ =
         local_80.layers_.super_RepeatedPtrFieldBase.current_size_ + 1;
    pNVar13 = (NeuralNetworkLayer *)
              (local_80.layers_.super_RepeatedPtrFieldBase.rep_)->elements[lVar18];
  }
  if (pNVar13->_oneof_case_[0] == 0x82) {
    LVar12 = pNVar13->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar13);
    pNVar13->_oneof_case_[0] = 0x82;
    uVar4 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    LVar12.activation_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                   (pAVar21);
    (pNVar13->layer_).activation_ = (ActivationParams *)LVar12;
  }
  if (*(int *)((long)&((LVar12.convolution_)->kernelsize_).arena_or_elements_ + 4) != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(LVar12.activation_);
    *(undefined4 *)((long)&((LVar12.convolution_)->kernelsize_).arena_or_elements_ + 4) = 10;
    uVar4 = ((LVar12.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar21);
    ((LVar12.activation_)->NonlinearityType_).relu_ = pAVar11;
  }
  uVar4 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
  puVar19 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar13->name_,"relu",puVar19);
  pRVar3 = (pNVar13->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00187609:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00187609;
    (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar15 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3975b4);
  pRVar3 = (pNVar13->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00187659:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->output_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00187659;
    (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar15 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3b5c76);
  if (MStack_d8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_d8);
    MStack_d8._oneof_case_[0] = 500;
    pAVar21 = (Arena *)(MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_d8.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar21);
  }
  TVar5 = MStack_d8.Type_;
  (MStack_d8.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_d8.Type_.pipeline_)->models_;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_d8.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001876f6:
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar13 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar13);
  }
  else {
    iVar1 = (MStack_d8.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_001876f6;
    (MStack_d8.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar13 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  uVar4 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
  puVar19 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar13->name_,"for_loop",puVar19);
  if (pNVar13->_oneof_case_[0] == 0x267) {
    LVar12 = pNVar13->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar13);
    pNVar13->_oneof_case_[0] = 0x267;
    uVar4 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    LVar12.loop_ = google::protobuf::Arena::
                   CreateMaybeMessage<CoreML::Specification::LoopLayerParams>(pAVar21);
    (pNVar13->layer_).loop_ = (LoopLayerParams *)LVar12;
  }
  this_01 = (LVar12.loop_)->bodynetwork_;
  if (this_01 == (NeuralNetwork *)0x0) {
    uVar4 = ((LVar12.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                        (pAVar21);
    (LVar12.loop_)->bodynetwork_ = this_01;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom(this_01,&local_80);
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(TVar5.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001877cd:
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar13 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar13);
  }
  else {
    iVar1 = (TVar5.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_001877cd;
    (TVar5.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar13 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  uVar4 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
  puVar19 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar13->name_,"copy",puVar19);
  pRVar3 = (pNVar13->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00187824:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00187824;
    (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar15 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3975b4);
  pRVar3 = (pNVar13->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar15 = pRVar3->elements[iVar1];
      goto LAB_0018788e;
    }
  }
  pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar13->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar13->output_).super_RepeatedPtrFieldBase,pbVar14);
LAB_0018788e:
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3b5c76);
  if (pNVar13->_oneof_case_[0] != 600) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar13);
    pNVar13->_oneof_case_[0] = 600;
    uVar4 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pCVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::CopyLayerParams>
                        (pAVar21);
    (pNVar13->layer_).copy_ = pCVar16;
  }
  CoreML::validate<(MLModelType)500>(&local_a8,&MStack_d8);
  bVar6 = CoreML::Result::good(&local_a8);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11b1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_message._M_dataplus._M_p != &local_a8.m_message.field_2) {
    operator_delete(local_a8.m_message._M_dataplus._M_p,
                    local_a8.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&local_80);
  CoreML::Specification::Model::~Model(&MStack_d8);
  return (uint)bVar6;
}

Assistant:

int testInvalidLoop1() {
    /*
     no input, no condition network, 0 max loop
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();


    Specification::NeuralNetwork nnBody;
    auto *l1 = nnBody.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("relu");
    l1->add_input("A");
    l1->add_output("B");

    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l2 = nnMain->add_layers();
    l2->set_name("for_loop");
    auto *loop_params = l2->mutable_loop();
    loop_params->mutable_bodynetwork()->CopyFrom(nnBody);

    auto *l3 = nnMain->add_layers();
    l3->set_name("copy");
    l3->add_input("A");
    l3->add_output("B");
    (void) l3->mutable_copy();

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}